

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

double __thiscall NEST::NESTcalc::NexONi(NESTcalc *this,double energy,double density)

{
  bool bVar1;
  double dVar2;
  Wvalue WVar3;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar1) {
    dVar2 = 0.21;
  }
  else {
    WVar3 = WorkFunction(density,this->fdetector->molarMass,this->fdetector->OldW13eV);
    dVar2 = erf(energy * 0.05);
    dVar2 = dVar2 * WVar3.alpha;
  }
  return dVar2;
}

Assistant:

double NESTcalc::NexONi(double energy, double density) {
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))
    return 0.21;  // https://arxiv.org/pdf/1903.05815.pdf
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double alpha = wvalue.alpha;
  return alpha * erf(0.05 * energy);
}